

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O0

DeepFrameBuffer * __thiscall
Imf_3_4::DeepScanLineOutputFile::frameBuffer(DeepScanLineOutputFile *this)

{
  mutex_type *pmVar1;
  lock_guard<std::mutex> *in_RDI;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffd8;
  
  std::lock_guard<std::mutex>::lock_guard(in_RDI,in_stack_ffffffffffffffd8);
  pmVar1 = in_RDI[1]._M_device;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1afdd4);
  return (DeepFrameBuffer *)((long)&pmVar1[1].super___mutex_base._M_mutex + 0x20);
}

Assistant:

const DeepFrameBuffer&
DeepScanLineOutputFile::frameBuffer () const
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif
    return _data->frameBuffer;
}